

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_dec.c
# Opt level: O0

void ParseIntraMode(VP8BitReader *br,VP8Decoder *dec,int mb_x)

{
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  int __c;
  undefined4 *__s;
  void *__s_00;
  long lVar4;
  int in_EDX;
  long in_RSI;
  int i;
  uint8_t *prob;
  int x;
  int ymode_1;
  int y;
  uint8_t *modes;
  int ymode;
  VP8MBData *block;
  uint8_t *left;
  uint8_t *top;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_4c;
  uint local_48;
  int local_44;
  undefined4 *local_40;
  
  __s = (undefined4 *)(*(long *)(in_RSI + 0xaf8) + (long)(in_EDX << 2));
  __s_00 = (void *)(in_RSI + 0xb00);
  lVar4 = *(long *)(in_RSI + 0xb60) + (long)in_EDX * 800;
  if (*(int *)(in_RSI + 0x88) == 0) {
    *(undefined1 *)(lVar4 + 0x31e) = 0;
  }
  else {
    iVar3 = VP8GetBit((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
    if (iVar3 == 0) {
      in_stack_ffffffffffffffa0 =
           VP8GetBit((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c);
    }
    else {
      iVar3 = VP8GetBit((VP8BitReader *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
      in_stack_ffffffffffffffa0 = iVar3 + 2;
    }
    *(char *)(lVar4 + 0x31e) = (char)in_stack_ffffffffffffffa0;
  }
  if (*(int *)(in_RSI + 0xaf0) != 0) {
    iVar3 = VP8GetBit((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
    *(char *)(lVar4 + 0x31d) = (char)iVar3;
  }
  iVar3 = VP8GetBit((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c);
  *(byte *)(lVar4 + 0x300) = (iVar3 != 0 ^ 0xffU) & 1;
  if (*(char *)(lVar4 + 0x300) == '\0') {
    iVar3 = VP8GetBit((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
    if (iVar3 == 0) {
      iVar3 = VP8GetBit((VP8BitReader *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
      __c = 0;
      if (iVar3 != 0) {
        __c = 2;
      }
    }
    else {
      iVar3 = VP8GetBit((VP8BitReader *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
      __c = 3;
      if (iVar3 != 0) {
        __c = 1;
      }
    }
    *(char *)(lVar4 + 0x301) = (char)__c;
    in_stack_ffffffffffffff9c = __c;
    memset(__s,__c,4);
    memset(__s_00,__c,4);
  }
  else {
    local_40 = (undefined4 *)(lVar4 + 0x301);
    for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
      local_48 = (uint)*(byte *)((long)__s_00 + (long)local_44);
      for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
        iVar3 = VP8GetBit((VP8BitReader *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c);
        cVar1 = ""[iVar3];
        while (in_stack_ffffffffffffffa4 = (int)cVar1, 0 < in_stack_ffffffffffffffa4) {
          iVar3 = VP8GetBit((VP8BitReader *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
          cVar1 = ""[in_stack_ffffffffffffffa4 * 2 + iVar3];
        }
        local_48 = -in_stack_ffffffffffffffa4;
        *(char *)((long)__s + (long)local_4c) = (char)local_48;
      }
      *local_40 = *__s;
      local_40 = local_40 + 1;
      *(char *)((long)__s_00 + (long)local_44) = (char)local_48;
    }
  }
  iVar3 = VP8GetBit((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c);
  if (iVar3 == 0) {
    uVar2 = 0;
  }
  else {
    iVar3 = VP8GetBit((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
    if (iVar3 == 0) {
      uVar2 = 2;
    }
    else {
      iVar3 = VP8GetBit((VP8BitReader *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
      uVar2 = 3;
      if (iVar3 != 0) {
        uVar2 = 1;
      }
    }
  }
  *(undefined1 *)(lVar4 + 0x311) = uVar2;
  return;
}

Assistant:

static void ParseIntraMode(VP8BitReader* const br,
                           VP8Decoder* const dec, int mb_x) {
  uint8_t* const top = dec->intra_t_ + 4 * mb_x;
  uint8_t* const left = dec->intra_l_;
  VP8MBData* const block = dec->mb_data_ + mb_x;

  // Note: we don't save segment map (yet), as we don't expect
  // to decode more than 1 keyframe.
  if (dec->segment_hdr_.update_map_) {
    // Hardcoded tree parsing
    block->segment_ = !VP8GetBit(br, dec->proba_.segments_[0], "segments")
                    ?  VP8GetBit(br, dec->proba_.segments_[1], "segments")
                    :  VP8GetBit(br, dec->proba_.segments_[2], "segments") + 2;
  } else {
    block->segment_ = 0;  // default for intra
  }
  if (dec->use_skip_proba_) block->skip_ = VP8GetBit(br, dec->skip_p_, "skip");

  block->is_i4x4_ = !VP8GetBit(br, 145, "block-size");
  if (!block->is_i4x4_) {
    // Hardcoded 16x16 intra-mode decision tree.
    const int ymode =
        VP8GetBit(br, 156, "pred-modes") ?
            (VP8GetBit(br, 128, "pred-modes") ? TM_PRED : H_PRED) :
            (VP8GetBit(br, 163, "pred-modes") ? V_PRED : DC_PRED);
    block->imodes_[0] = ymode;
    memset(top, ymode, 4 * sizeof(*top));
    memset(left, ymode, 4 * sizeof(*left));
  } else {
    uint8_t* modes = block->imodes_;
    int y;
    for (y = 0; y < 4; ++y) {
      int ymode = left[y];
      int x;
      for (x = 0; x < 4; ++x) {
        const uint8_t* const prob = kBModesProba[top[x]][ymode];
#if (USE_GENERIC_TREE == 1)
        // Generic tree-parsing
        int i = kYModesIntra4[VP8GetBit(br, prob[0], "pred-modes")];
        while (i > 0) {
          i = kYModesIntra4[2 * i + VP8GetBit(br, prob[i], "pred-modes")];
        }
        ymode = -i;
#else
        // Hardcoded tree parsing
        ymode = !VP8GetBit(br, prob[0], "pred-modes") ? B_DC_PRED :
                  !VP8GetBit(br, prob[1], "pred-modes") ? B_TM_PRED :
                    !VP8GetBit(br, prob[2], "pred-modes") ? B_VE_PRED :
                      !VP8GetBit(br, prob[3], "pred-modes") ?
                        (!VP8GetBit(br, prob[4], "pred-modes") ? B_HE_PRED :
                          (!VP8GetBit(br, prob[5], "pred-modes") ? B_RD_PRED
                                                                 : B_VR_PRED)) :
                        (!VP8GetBit(br, prob[6], "pred-modes") ? B_LD_PRED :
                          (!VP8GetBit(br, prob[7], "pred-modes") ? B_VL_PRED :
                            (!VP8GetBit(br, prob[8], "pred-modes") ? B_HD_PRED
                                                                   : B_HU_PRED))
                        );
#endif  // USE_GENERIC_TREE
        top[x] = ymode;
      }
      memcpy(modes, top, 4 * sizeof(*top));
      modes += 4;
      left[y] = ymode;
    }
  }
  // Hardcoded UVMode decision tree
  block->uvmode_ = !VP8GetBit(br, 142, "pred-modes-uv") ? DC_PRED
                 : !VP8GetBit(br, 114, "pred-modes-uv") ? V_PRED
                 : VP8GetBit(br, 183, "pred-modes-uv") ? TM_PRED : H_PRED;
}